

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::callPassThrough
          (TestMembraneImpl *this,CallPassThroughContext context)

{
  PromiseArena *pPVar1;
  SegmentBuilder *pSVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  CapTableReader *pCVar5;
  RequestHook *pRVar6;
  int iVar7;
  void *pvVar8;
  size_t in_RCX;
  long *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int in_R8D;
  TransformPromiseNodeBase *this_00;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  req;
  Reader params;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_118;
  undefined1 local_e0 [16];
  CapTableReader *pCStack_d0;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_c8;
  StructReader local_88;
  undefined1 local_58 [24];
  Maybe<capnp::MessageSize> local_40;
  
  (**(code **)*in_RDX)(&local_118);
  local_c8.super_Builder._builder.data = local_118.super_Builder._builder.data;
  local_c8.super_Builder._builder.pointers = local_118.super_Builder._builder.pointers;
  local_c8.super_Builder._builder.segment = local_118.super_Builder._builder.segment;
  PointerReader::getStruct(&local_88,(PointerReader *)&local_c8,(word *)0x0);
  bVar9 = local_88.pointerCount != 0;
  local_118.super_Builder._builder.data = (WirePointer *)0x0;
  if (bVar9) {
    local_118.super_Builder._builder.data = local_88.pointers;
  }
  iVar7 = 0x7fffffff;
  if (bVar9) {
    iVar7 = local_88.nestingLimit;
  }
  uVar10 = 0;
  uVar11 = 0;
  local_118.super_Builder._builder.capTable._0_4_ = 0;
  local_118.super_Builder._builder.capTable._4_4_ = 0;
  if (bVar9) {
    uVar10 = local_88.segment._0_4_;
    uVar11 = local_88.segment._4_4_;
    local_118.super_Builder._builder.capTable._0_4_ = local_88.capTable._0_4_;
    local_118.super_Builder._builder.capTable._4_4_ = local_88.capTable._4_4_;
  }
  local_118.super_Builder._builder.segment = (SegmentBuilder *)CONCAT44(uVar11,uVar10);
  local_118.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_118.super_Builder._builder.pointers._4_4_,iVar7);
  PointerReader::getCapability((PointerReader *)local_58);
  local_e0._8_8_ = local_58._0_8_;
  pCStack_d0 = (CapTableReader *)local_58._8_8_;
  local_e0._0_8_ = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Thing::Client::passThroughRequest
            (&local_c8,(Client *)local_e0,&local_40);
  pCVar5 = pCStack_d0;
  pvVar8 = extraout_RDX;
  if (pCStack_d0 != (CapTableReader *)0x0) {
    pCStack_d0 = (CapTableReader *)0x0;
    (*(code *)(*(Arena **)local_e0._8_8_)->_vptr_Arena)
              (local_e0._8_8_,pCVar5->_vptr_CapTableReader[-2] + (long)&pCVar5->_vptr_CapTableReader
              );
    pvVar8 = extraout_RDX_00;
  }
  if ((local_88.dataSize == 0) || ((*local_88.data & 1) == 0)) {
    Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::send(&local_118,(int)&local_c8,pvVar8,in_RCX,in_R8D);
    pSVar2 = local_118.super_Builder._builder.segment;
    pPVar1 = *(PromiseArena **)&((local_118.super_Builder._builder.segment)->super_SegmentReader).id
    ;
    if (pPVar1 == (PromiseArena *)0x0 ||
        (ulong)((long)local_118.super_Builder._builder.segment - (long)pPVar1) < 0x28) {
      pvVar8 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_118,
                 kj::_::
                 SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:68:11)>
                 ::anon_class_8_1_bc11688f_for_func::operator());
      *(undefined ***)((long)pvVar8 + 0x3d8) = &PTR_destroy_006b78a8;
      *(long **)((long)pvVar8 + 0x3f8) = in_RDX;
      *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
    }
    else {
      *(PromiseArena **)&((local_118.super_Builder._builder.segment)->super_SegmentReader).id =
           (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &local_118.super_Builder._builder.segment[-1].super_SegmentReader.ptr;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_118,
                 kj::_::
                 SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:68:11)>
                 ::anon_class_8_1_bc11688f_for_func::operator());
      pSVar2[-1].super_SegmentReader.ptr.ptr = (word *)&PTR_destroy_006b78a8;
      *(long **)&pSVar2[-1].readOnly = in_RDX;
      pSVar2[-1].super_SegmentReader.ptr.size_ = (size_t)pPVar1;
    }
    uVar4 = local_118.super_Builder._builder._32_8_;
    pWVar3 = local_118.super_Builder._builder.pointers;
    (this->super_Server)._vptr_Server = (_func_int **)this_00;
    if (local_118.super_Builder._builder.pointers != (WirePointer *)0x0) {
      local_118.super_Builder._builder.pointers = (WirePointer *)0x0;
      local_118.super_Builder._builder.dataSize = 0;
      local_118.super_Builder._builder.pointerCount = 0;
      local_118.super_Builder._builder._38_2_ = 0;
      (**(local_118.hook.disposer)->_vptr_Disposer)(local_118.hook.disposer,pWVar3,8,uVar4,uVar4,0);
    }
    pvVar8 = local_118.super_Builder._builder.data;
    if ((WirePointer *)local_118.super_Builder._builder.data != (WirePointer *)0x0) {
      local_118.super_Builder._builder.data = (WirePointer *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_118.super_Builder._builder.capTable._4_4_,
                           local_118.super_Builder._builder.capTable._0_4_))
                ((undefined8 *)
                 CONCAT44(local_118.super_Builder._builder.capTable._4_4_,
                          local_118.super_Builder._builder.capTable._0_4_),
                 (long)&((WireValue<uint32_t>_conflict *)pvVar8)->value +
                 *(long *)((long)*pvVar8 + -0x10));
    }
    pSVar2 = local_118.super_Builder._builder.segment;
    if (local_118.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
      local_118.super_Builder._builder.segment = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar2);
    }
  }
  else {
    (**(code **)(*in_RDX + 0x18))(this);
  }
  pRVar6 = local_c8.hook.ptr;
  if (local_c8.hook.ptr != (RequestHook *)0x0) {
    local_c8.hook.ptr = (RequestHook *)0x0;
    (**(local_c8.hook.disposer)->_vptr_Disposer)
              (local_c8.hook.disposer,
               (_func_int *)((long)&pRVar6->_vptr_RequestHook + (long)pRVar6->_vptr_RequestHook[-2])
              );
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }